

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_uint mz_zip_reader_get_filename
                  (mz_zip_archive *pZip,mz_uint file_index,char *pFilename,mz_uint filename_buf_size
                  )

{
  ushort uVar1;
  uint uVar2;
  mz_zip_internal_state *pmVar3;
  void *pvVar4;
  uint uVar5;
  mz_uint mVar6;
  
  if ((((pZip == (mz_zip_archive *)0x0) ||
       (pmVar3 = pZip->m_pState, pmVar3 == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) ||
     ((pZip->m_zip_mode != MZ_ZIP_MODE_READING ||
      (pvVar4 = (pmVar3->m_central_dir).m_p, pvVar4 == (void *)0x0)))) {
    mVar6 = 0;
    if (filename_buf_size != 0) {
      *pFilename = '\0';
    }
  }
  else {
    uVar2 = *(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4);
    uVar1 = *(ushort *)((long)pvVar4 + (ulong)uVar2 + 0x1c);
    uVar5 = (uint)uVar1;
    if (filename_buf_size != 0) {
      uVar5 = filename_buf_size - 1;
      if ((uint)uVar1 <= filename_buf_size - 1) {
        uVar5 = (uint)uVar1;
      }
      __wrap_memcpy(pFilename,(void *)((long)pvVar4 + (ulong)uVar2 + 0x2e),(ulong)uVar5);
      pFilename[uVar5] = '\0';
    }
    mVar6 = uVar5 + 1;
  }
  return mVar6;
}

Assistant:

mz_uint mz_zip_reader_get_filename(mz_zip_archive *pZip, mz_uint file_index, char *pFilename, mz_uint filename_buf_size)
{
  mz_uint n;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  if (!p) { if (filename_buf_size) pFilename[0] = '\0'; return 0; }
  n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  if (filename_buf_size)
  {
    n = MZ_MIN(n, filename_buf_size - 1);
    memcpy(pFilename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pFilename[n] = '\0';
  }
  return n + 1;
}